

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O2

void __thiscall
Ratio::addAllFEdges(Ratio *this,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges)

{
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *this_00;
  pointer pPVar1;
  PhyloTreeEdge *f;
  pointer __x;
  double dVar2;
  
  this_00 = &this->fEdges;
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve
            (this_00,((long)(this->fEdges).
                            super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->fEdges).
                           super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl
                           .super__Vector_impl_data._M_start) / 0x48 +
                     ((long)(edges->
                            super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 0x48);
  pPVar1 = (edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (__x = (edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_start; __x != pPVar1; __x = __x + 1) {
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back(this_00,__x);
  }
  dVar2 = geoAvg(this_00);
  this->fLength = dVar2;
  return;
}

Assistant:

void Ratio::addAllFEdges(vector<PhyloTreeEdge>& edges) {
    fEdges.reserve(fEdges.size() + edges.size());
    for (auto &f : edges) {
        fEdges.push_back(f);
    }
    fLength = geoAvg(fEdges);
}